

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::BaseTag::MostLikelyOpponentPosition
          (BaseTag *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  double dVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  pointer piVar4;
  State *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int iVar8;
  int i_1;
  long lVar9;
  long lVar10;
  double dVar11;
  allocator_type local_11;
  
  if ((MostLikelyOpponentPosition(std::vector<despot::State*,std::allocator<despot::State*>>const&)
       ::probs == '\0') && (iVar8 = __cxa_guard_acquire(), iVar8 != 0)) {
    iVar8 = despot::Floor::NumCells();
    std::vector<double,_std::allocator<double>_>::vector
              (&MostLikelyOpponentPosition::probs,(long)iVar8,&local_11);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                 &MostLikelyOpponentPosition::probs,&__dso_handle);
    __cxa_guard_release();
  }
  pdVar6 = MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  piVar4 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0;
      pdVar7 = MostLikelyOpponentPosition::probs.super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start,
      (long)ppSVar3 - (long)ppSVar2 >> 3 != lVar10; lVar10 = lVar10 + 1) {
    pSVar5 = ppSVar2[lVar10];
    iVar8 = piVar4[*(int *)(pSVar5 + 0xc)];
    pdVar6[iVar8] = *(double *)(pSVar5 + 0x18) + pdVar6[iVar8];
  }
  lVar10 = (long)MostLikelyOpponentPosition::probs.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)MostLikelyOpponentPosition::probs.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
  dVar11 = 0.0;
  for (lVar9 = 0; lVar10 >> 3 != lVar9; lVar9 = lVar9 + 1) {
    dVar1 = pdVar7[lVar9];
    pdVar7[lVar9] = 0.0;
    if (dVar1 <= dVar11) {
      dVar1 = dVar11;
    }
    dVar11 = dVar1;
  }
  despot::Floor::GetCell((int)this + 0x58);
  return;
}

Assistant:

Coord BaseTag::MostLikelyOpponentPosition(
	const vector<State*>& particles) const {
	static vector<double> probs = vector<double>(floor_.NumCells());

	for (int i = 0; i < particles.size(); i++) {
		TagState* tagstate = static_cast<TagState*>(particles[i]);
		probs[opp_[tagstate->state_id]] += tagstate->weight;
	}

	double maxWeight = 0;
	int opp = -1;
	for (int i = 0; i < probs.size(); i++) {
		if (probs[i] > maxWeight) {
			maxWeight = probs[i];
			opp = i;
		}
		probs[i] = 0.0;
	}

	return floor_.GetCell(opp);
}